

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

LossLayer *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::LossLayer>::New(Arena *arena)

{
  Arena *arena_local;
  LossLayer *local_28;
  LossLayer *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (LossLayer *)operator_new(0x28);
    CoreML::Specification::LossLayer::LossLayer(local_28);
  }
  else {
    local_28 = (LossLayer *)
               Arena::AllocateAligned
                         (arena,(type_info *)&CoreML::Specification::LossLayer::typeinfo,0x28);
    CoreML::Specification::LossLayer::LossLayer(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<CoreML::Specification::LossLayer>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }